

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O1

int Extra_ThreshSelectWeights3(word *t,int nVars,int *pW)

{
  uint uVar1;
  int Cost;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int Cost_1;
  int iVar9;
  bool bVar10;
  int i;
  long lVar11;
  
  uVar7 = 1;
  uVar8 = 1 << ((byte)nVars & 0x1f);
  if (nVars != 3) {
    __assert_fail("nVars == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddThresh.c"
                  ,0xa3,"int Extra_ThreshSelectWeights3(word *, int, int *)");
  }
  pW[2] = 1;
  do {
    pW[1] = uVar7;
    uVar3 = uVar7;
    do {
      *pW = uVar3;
      uVar1 = uVar3;
      do {
        iVar2 = 10000;
        iVar9 = 0;
        bVar10 = true;
        uVar5 = 0;
        do {
          uVar4 = (uint)uVar5;
          if ((t[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0) {
            lVar11 = 0;
            iVar6 = 0;
            do {
              if ((uVar4 >> ((uint)lVar11 & 0x1f) & 1) != 0) {
                iVar6 = iVar6 + pW[lVar11];
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 != 3);
            if (iVar9 <= iVar6) {
              iVar9 = iVar6;
            }
          }
          else {
            lVar11 = 0;
            iVar6 = 0;
            do {
              if ((uVar4 >> ((uint)lVar11 & 0x1f) & 1) != 0) {
                iVar6 = iVar6 + pW[lVar11];
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 != 3);
            if (iVar6 <= iVar2) {
              iVar2 = iVar6;
            }
          }
          if (iVar2 <= iVar9) break;
          uVar4 = uVar4 + 1;
          uVar5 = (ulong)uVar4;
          bVar10 = (int)uVar4 < (int)uVar8;
        } while (uVar4 != uVar8);
        if (!bVar10) {
          if (iVar9 < iVar2) {
            return iVar2;
          }
          __assert_fail("Lmax < Lmin",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddThresh.c"
                        ,0xb7,"int Extra_ThreshSelectWeights3(word *, int, int *)");
        }
        *pW = uVar1 + 1;
        bVar10 = uVar1 < 3;
        uVar1 = uVar1 + 1;
      } while (bVar10);
      uVar3 = uVar3 + 1;
      pW[1] = uVar3;
    } while (uVar3 != 4);
    uVar7 = uVar7 + 1;
    pW[2] = uVar7;
    if (uVar7 == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights3(word * t, int nVars, int * pW) {
	int m, Lmin, Lmax, nMints = (1 << nVars);
	assert(nVars == 3);
	for (pW[2] = 1; pW[2] <= nVars; pW[2]++)
		for (pW[1] = pW[2]; pW[1] <= nVars; pW[1]++)
			for (pW[0] = pW[1]; pW[0] <= nVars; pW[0]++) {
				Lmin = 10000;
				Lmax = 0;
				for (m = 0; m < nMints; m++) {
					if (Abc_TtGetBit(t, m))
						Lmin = Abc_MinInt(Lmin,
								Extra_ThreshWeightedSum(pW, nVars, m));
					else
						Lmax = Abc_MaxInt(Lmax,
								Extra_ThreshWeightedSum(pW, nVars, m));
					if (Lmax >= Lmin)
						break;
//            printf( "%c%d ", Abc_TtGetBit(t, m) ? '+' : '-', Extra_ThreshWeightedSum(pW, nVars, m) );
				}
//        printf( "  -%d +%d\n", Lmax, Lmin );
				if (m < nMints)
					continue;
				assert(Lmax < Lmin);
				return Lmin;
			}
	return 0;
}